

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
reserve(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *this,size_t count)

{
  char *pcVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  ulong uVar10;
  
  if (count >> 0x3b == 0) {
    uVar6 = this->buffer_capacity;
    if (uVar6 < count) {
      uVar10 = 8;
      if (8 < uVar6) {
        uVar10 = uVar6;
      }
      do {
        uVar6 = uVar10;
        uVar10 = uVar6 * 2;
      } while (uVar6 < count);
      if (uVar6 < 9) {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->stack_storage;
      }
      else {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 malloc(uVar6 << 5);
        if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_001a435c;
      }
      pbVar8 = (this->
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).ptr;
      if ((pbVar7 != pbVar8) &&
         ((this->
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).buffer_size != 0)) {
        lVar9 = 0x10;
        uVar10 = 0;
        do {
          pcVar1 = (char *)((long)&(pbVar7->_M_dataplus)._M_p + lVar9);
          pbVar8 = (this->
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).ptr;
          puVar2 = (undefined8 *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9);
          *(char **)((long)pbVar7 + lVar9 + -0x10) = pcVar1;
          puVar3 = *(undefined8 **)((long)pbVar8 + lVar9 + -0x10);
          if (puVar2 == puVar3) {
            uVar5 = puVar2[1];
            *(undefined8 *)pcVar1 = *puVar2;
            *(undefined8 *)(pcVar1 + 8) = uVar5;
          }
          else {
            *(undefined8 **)((long)pbVar7 + lVar9 + -0x10) = puVar3;
            *(undefined8 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar9) = *puVar2;
          }
          *(undefined8 *)((long)pbVar7 + lVar9 + -8) = *(undefined8 *)((long)pbVar8 + lVar9 + -8);
          *(undefined8 **)((long)pbVar8 + lVar9 + -0x10) = puVar2;
          *(undefined8 *)((long)pbVar8 + lVar9 + -8) = 0;
          *(undefined1 *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9) = 0;
          pbVar8 = (this->
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).ptr;
          pvVar4 = *(void **)((long)pbVar8 + lVar9 + -0x10);
          if ((void *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9) != pvVar4) {
            operator_delete(pvVar4);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < (this->
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).buffer_size);
        pbVar8 = (this->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
      }
      if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this->stack_storage) {
        free(pbVar8);
      }
      (this->
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).ptr = pbVar7;
      this->buffer_capacity = uVar6;
    }
    return;
  }
LAB_001a435c:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > std::numeric_limits<size_t>::max() / sizeof(T)) ||
		    (count > std::numeric_limits<size_t>::max() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}